

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

int Abc_NtkRemoveSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pFaninNew;
  int iVar4;
  long lVar5;
  
  pVVar3 = pNtk->vBoxes;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar3->pArray[lVar5];
      if (((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) &&
         (iVar2 = Abc_NtkLatchIsSelfFeed(pAVar1), iVar2 != 0)) {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          pFaninNew = Abc_AigConst1(pNtk);
        }
        else {
          pFaninNew = Abc_NtkCreateNodeConst1(pNtk);
        }
        pAVar1 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
        Abc_ObjPatchFanin(pAVar1,(Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]
                          ,pFaninNew);
        iVar4 = iVar4 + 1;
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vBoxes;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar4;
}

Assistant:

int Abc_NtkRemoveSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pConst1;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_NtkLatchIsSelfFeed( pLatch ) )
        {
            if ( Abc_NtkIsStrash(pNtk) )
                pConst1 = Abc_AigConst1(pNtk);
            else
                pConst1 = Abc_NtkCreateNodeConst1(pNtk);
            Abc_ObjPatchFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(Abc_ObjFanin0(pLatch)), pConst1 );
            Counter++;
        }
    }
    return Counter;
}